

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecBit.h
# Opt level: O1

void Vec_BitWriteEntry(Vec_Bit_t *p,int i,int Entry)

{
  if ((-1 < i) && (i < p->nSize)) {
    p->pArray[(uint)i >> 5] = p->pArray[(uint)i >> 5] | 1 << ((byte)i & 0x1f);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
}

Assistant:

static inline void Vec_BitWriteEntry( Vec_Bit_t * p, int i, int Entry )
{
    assert( i >= 0 && i < p->nSize );
    if ( Entry == 1 )
        p->pArray[i >> 5] |=  (1 << (i & 31));
    else if ( Entry == 0 )
        p->pArray[i >> 5] &= ~(1 << (i & 31));
    else assert(0);
}